

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O0

void __thiscall
mocker::ir::BuilderContext::
emplaceInst<mocker::ir::Branch,std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>,std::shared_ptr<mocker::ir::Label>>
          (BuilderContext *this,shared_ptr<mocker::ir::Addr> *args,
          shared_ptr<mocker::ir::Label> *args_1,shared_ptr<mocker::ir::Label> *args_2)

{
  shared_ptr<mocker::ir::IRInst> local_48;
  undefined1 local_38 [8];
  shared_ptr<mocker::ir::Branch> inst;
  shared_ptr<mocker::ir::Label> *args_local_2;
  shared_ptr<mocker::ir::Label> *args_local_1;
  shared_ptr<mocker::ir::Addr> *args_local;
  BuilderContext *this_local;
  
  inst.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)args_2;
  std::
  make_shared<mocker::ir::Branch,std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>,std::shared_ptr<mocker::ir::Label>>
            ((shared_ptr<mocker::ir::Addr> *)local_38,(shared_ptr<mocker::ir::Label> *)args,args_1);
  std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Branch,void>
            (&local_48,(shared_ptr<mocker::ir::Branch> *)local_38);
  appendInst(this,&local_48);
  std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_48);
  std::shared_ptr<mocker::ir::Branch>::~shared_ptr((shared_ptr<mocker::ir::Branch> *)local_38);
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    auto inst = std::make_shared<InstType>(std::forward<Args>(args)...);
    appendInst(std::move(inst));
  }